

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Status __thiscall
leveldb::Table::Open
          (Table *this,Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  Block *this_00;
  Rep *this_01;
  uint64_t uVar1;
  Table *this_02;
  long lVar2;
  Options *pOVar3;
  Rep *pRVar4;
  byte bVar5;
  BlockContents index_block_contents;
  ReadOptions opt;
  Footer footer;
  Slice footer_input;
  char footer_space [48];
  Rep *local_c8;
  undefined1 local_c0 [32];
  undefined8 local_a0;
  Footer local_98;
  char *local_78;
  undefined8 local_70;
  Slice local_68 [3];
  
  bVar5 = 0;
  *table = (Table *)0x0;
  if (size < 0x30) {
    local_68[0].data_ = "file is too short to be an sstable";
    local_68[0].size_ = 0x22;
    local_98.metaindex_handle_.offset_ = 0x112151;
    local_98.metaindex_handle_.size_ = 0;
    Status::Status((Status *)this,kCorruption,local_68,(Slice *)&local_98);
  }
  else {
    local_78 = "";
    local_70 = 0;
    (*file->_vptr_RandomAccessFile[2])(this,file,size - 0x30,0x30,&local_78,local_68);
    if (this->rep_ == (Rep *)0x0) {
      local_98.index_handle_.offset_._0_4_ = 0xffffffff;
      local_98.index_handle_.offset_._4_4_ = 0xffffffff;
      local_98.index_handle_.size_._0_4_ = 0xffffffff;
      local_98.index_handle_.size_._4_4_ = 0xffffffff;
      local_98.metaindex_handle_.offset_ = 0xffffffffffffffff;
      local_98.metaindex_handle_.size_ = 0xffffffffffffffff;
      Footer::DecodeFrom((Footer *)local_c0,(Slice *)&local_98);
      pRVar4 = this->rep_;
      this->rep_ = (Rep *)local_c0._0_8_;
      if (pRVar4 != (Rep *)0x0) {
        local_c0._0_8_ = pRVar4;
        operator_delete__(pRVar4);
      }
      if (this->rep_ == (Rep *)0x0) {
        local_c0._0_8_ = "";
        local_c0._8_8_ = 0;
        local_c0._24_2_ = 0x100;
        local_a0 = 0;
        if (options->paranoid_checks == true) {
          local_c0._24_2_ = 0x101;
        }
        ReadBlock((leveldb *)&local_c8,file,(ReadOptions *)(local_c0 + 0x18),&local_98.index_handle_
                  ,(BlockContents *)local_c0);
        pRVar4 = this->rep_;
        this->rep_ = local_c8;
        local_c8 = pRVar4;
        if (pRVar4 != (Rep *)0x0) {
          operator_delete__(pRVar4);
        }
        if (this->rep_ == (Rep *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,(BlockContents *)local_c0);
          this_01 = (Rep *)operator_new(0xa0);
          Options::Options((Options *)this_01);
          (this_01->status).state_ = (char *)0x0;
          pOVar3 = options;
          pRVar4 = this_01;
          for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
            (pRVar4->options).comparator = pOVar3->comparator;
            pOVar3 = (Options *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
            pRVar4 = (Rep *)((long)pRVar4 + (ulong)bVar5 * -0x10 + 8);
          }
          this_01->file = file;
          (this_01->metaindex_handle).offset_ = local_98.metaindex_handle_.offset_;
          (this_01->metaindex_handle).size_ = local_98.metaindex_handle_.size_;
          this_01->index_block = this_00;
          if (options->block_cache == (Cache *)0x0) {
            uVar1 = 0;
          }
          else {
            uVar1 = (**(code **)(*(long *)options->block_cache + 0x38))();
          }
          this_01->cache_id = uVar1;
          this_01->filter = (FilterBlockReader *)0x0;
          this_01->filter_data = (char *)0x0;
          this_02 = (Table *)operator_new(8);
          this_02->rep_ = this_01;
          *table = this_02;
          ReadMeta(this_02,&local_98);
        }
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}